

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall Engine_testSetDoubleNoTags_Test::TestBody(Engine_testSetDoubleNoTags_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  pointer pHVar2;
  char *pcVar3;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  value_type im;
  AssertionResult gtest_ar;
  TestHandler *th;
  value_type *h;
  Engine e;
  string *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  undefined1 uVar4;
  Measure<double> *in_stack_fffffffffffffd98;
  int line;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined1 uVar5;
  undefined8 in_stack_fffffffffffffda8;
  Type type;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined1 uVar6;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  char *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  long local_228;
  Message *message;
  AssertHelper *this_01;
  AssertionResult local_1d8 [2];
  undefined8 local_1b8;
  AssertionResult local_1b0 [2];
  undefined4 local_18c;
  AssertionResult local_188 [2];
  undefined4 local_164;
  AssertionResult local_160 [2];
  AssertionResult local_140 [5];
  vector<Tag,_std::allocator<Tag>_> local_f0;
  uint local_d4;
  size_type local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  long local_a0;
  const_reference local_98;
  undefined8 local_90;
  allocator local_81;
  string local_80 [48];
  Message local_50;
  AssertHelper local_48;
  Engine local_40;
  
  type = (Type)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  message = &local_50;
  std::make_unique<TestHandler>();
  this_01 = &local_48;
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),in_stack_fffffffffffffd88
            );
  Engine::Engine((Engine *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8,
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"gauge.value",&local_81);
  local_90 = 0x405900083126e979;
  Engine::Set<double,_nullptr>
            ((Engine *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78,(double *)0x123f25);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  this_00 = Engine::GetHandlers(&local_40);
  local_98 = std::
             vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             ::operator[](this_00,0);
  pHVar2 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                     ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                      CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  if (pHVar2 == (pointer)0x0) {
    local_228 = 0;
  }
  else {
    local_228 = __dynamic_cast(pHVar2,&Handler::typeinfo,&TestHandler::typeinfo,0);
  }
  local_a0 = local_228;
  local_b4 = 1;
  local_c0 = std::vector<Measure<double>,_std::allocator<Measure<double>_>_>::size
                       ((vector<Measure<double>,_std::allocator<Measure<double>_>_> *)
                        (local_228 + 0x20));
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffffd98,
             (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             (int *)in_stack_fffffffffffffd88,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    testing::AssertionResult::failure_message((AssertionResult *)0x124100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),type,
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    testing::Message::~Message((Message *)0x12415d);
  }
  local_d4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1241cb);
  if (local_d4 == 0) {
    std::vector<Measure<double>,_std::allocator<Measure<double>_>_>::operator[]
              ((vector<Measure<double>,_std::allocator<Measure<double>_>_> *)(local_a0 + 0x20),0);
    Measure<double>::Measure
              ((Measure<double> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffd98,
               (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (char (*) [17])in_stack_fffffffffffffd88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      testing::AssertionResult::failure_message((AssertionResult *)0x1242b1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),type,
                 (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      testing::internal::AssertHelper::operator=(this_01,message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      testing::Message::~Message((Message *)0x12430e);
    }
    local_d4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12437c);
    if (local_d4 == 0) {
      local_164 = 1;
      testing::internal::EqHelper<false>::Compare<MetricTypes::MetricType,MetricTypes::MetricType>
                ((char *)in_stack_fffffffffffffd98,
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 (MetricType *)in_stack_fffffffffffffd88,
                 (MetricType *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
      uVar6 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffdb0));
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x12442e);
        type = (Type)((ulong)pcVar3 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdb0),type,
                   (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
        testing::internal::AssertHelper::operator=(this_01,message);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        testing::Message::~Message((Message *)0x12448b);
      }
      local_d4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1244f9);
      if (local_d4 == 0) {
        local_18c = 1;
        testing::internal::EqHelper<false>::Compare<int,float>
                  ((char *)in_stack_fffffffffffffd98,
                   (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                   (int *)in_stack_fffffffffffffd88,
                   (float *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
        uVar5 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffdb0));
          in_stack_fffffffffffffd98 =
               (Measure<double> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x1245ab);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdb0),type,
                     (char *)CONCAT17(uVar5,in_stack_fffffffffffffda0),
                     (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
          testing::internal::AssertHelper::operator=(this_01,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
          testing::Message::~Message((Message *)0x124608);
        }
        local_d4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x124676);
        if (local_d4 == 0) {
          local_1b8 = 0x405900083126e979;
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((char *)in_stack_fffffffffffffd98,
                     (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                     (double *)in_stack_fffffffffffffd88,
                     (double *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b0);
          uVar4 = bVar1;
          if (!bVar1) {
            testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffdb0));
            in_stack_fffffffffffffd88 =
                 (unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x12472f);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdb0),type,
                       (char *)CONCAT17(uVar5,in_stack_fffffffffffffda0),
                       (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                       (char *)CONCAT17(uVar4,in_stack_fffffffffffffd90));
            testing::internal::AssertHelper::operator=(this_01,message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80)
                      );
            testing::Message::~Message((Message *)0x12478c);
          }
          local_d4 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1247fa);
          if (local_d4 == 0) {
            std::vector<Tag,_std::allocator<Tag>_>::size(&local_f0);
            testing::internal::EqHelper<true>::Compare<int,unsigned_long>
                      ((char *)in_stack_fffffffffffffd98,
                       (char *)CONCAT17(uVar4,in_stack_fffffffffffffd90),
                       (int *)in_stack_fffffffffffffd88,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                       in_stack_fffffffffffffd78);
            line = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
            in_stack_fffffffffffffd87 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffdb0));
              testing::AssertionResult::failure_message((AssertionResult *)0x1248c6);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdb0),type,
                         (char *)CONCAT17(uVar5,in_stack_fffffffffffffda0),line,
                         (char *)CONCAT17(uVar4,in_stack_fffffffffffffd90));
              testing::internal::AssertHelper::operator=(this_01,message);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
              testing::Message::~Message((Message *)0x124921);
            }
            local_d4 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x12498c);
            if (local_d4 == 0) {
              local_d4 = 0;
            }
          }
        }
      }
    }
    Measure<double>::~Measure
              ((Measure<double> *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  }
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  return;
}

Assistant:

TEST(Engine, testSetDoubleNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Set("gauge.value", 100.0005);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(0, im.tags.size());
}